

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_normalize(float64 ***out,gauden_t *g)

{
  uint uVar1;
  float64 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar3 = (ulong)g->n_mgau;
  if (uVar3 == 0) {
    return 0;
  }
  uVar1 = g->n_feat;
  uVar4 = 0;
  do {
    if ((ulong)uVar1 != 0) {
      uVar6 = (ulong)g->n_top;
      uVar5 = 0;
      do {
        if (uVar6 == 0) {
LAB_0011dd63:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x5af,"densities for feature %u sum to zero\n",uVar5,uVar6,uVar3);
          return -1;
        }
        dVar8 = 0.0;
        uVar7 = 0;
        do {
          dVar8 = dVar8 + (double)out[uVar4][uVar5][uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
        if ((dVar8 == 0.0) && (!NAN(dVar8))) goto LAB_0011dd63;
        if (uVar6 != 0) {
          pfVar2 = out[uVar4][uVar5];
          uVar7 = 0;
          do {
            pfVar2[uVar7] = (float64)((double)pfVar2[uVar7] / dVar8);
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == uVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

int
gauden_normalize(float64 ***out,
		 gauden_t *g)
{
    float64 sum;
    uint32 i, j, k;
    int ret = S3_SUCCESS;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    sum = 0;

	    for (k = 0; k < g->n_top; k++) {
		sum += out[i][j][k];
	    }

	    if (sum != 0) {
		for (k = 0; k < g->n_top; k++) {
		    out[i][j][k] /= sum;
		}
	    }
	    else {
		E_ERROR("densities for feature %u sum to zero\n", j);

		return S3_ERROR;
	    }
	}
    }

    return ret;
}